

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O0

HTMLElement * __thiscall choc::html::HTMLElement::addSpan(HTMLElement *this,string_view classToUse)

{
  string_view value;
  HTMLElement *pHVar1;
  allocator<char> local_41;
  string local_40;
  HTMLElement *local_20;
  HTMLElement *this_local;
  string_view classToUse_local;
  
  classToUse_local._M_len = (size_t)classToUse._M_str;
  this_local = (HTMLElement *)classToUse._M_len;
  local_20 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"span",&local_41);
  pHVar1 = addChild(this,&local_40);
  pHVar1 = setInline(pHVar1,true);
  value._M_str = (char *)classToUse_local._M_len;
  value._M_len = (size_t)this_local;
  pHVar1 = setClass(pHVar1,value);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return pHVar1;
}

Assistant:

HTMLElement& addSpan (std::string_view classToUse)  { return addChild ("span").setInline (true).setClass (classToUse); }